

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O0

int nettlp_msg_socket(in_addr addr)

{
  undefined4 in_EDI;
  sockaddr_in saddr;
  int ret;
  int fd;
  sockaddr local_20;
  int local_c;
  char local_8 [4];
  int local_4;
  
  local_8 = (char  [4])in_EDI;
  local_c = socket(2,2,0x11);
  local_4 = local_c;
  if (-1 < local_c) {
    memset(&local_20,0,0x10);
    local_20.sa_family = 2;
    local_20.sa_data[2] = local_8[0];
    local_20.sa_data[3] = local_8[1];
    local_20.sa_data[4] = local_8[2];
    local_20.sa_data[5] = local_8[3];
    local_20.sa_data._0_2_ = htons(0x2fff);
    local_4 = connect(local_c,&local_20,0x10);
    if (-1 < local_4) {
      local_4 = local_c;
    }
  }
  return local_4;
}

Assistant:

static int nettlp_msg_socket(struct in_addr addr)
{
	int fd, ret;
	struct sockaddr_in saddr;

	fd = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP);
	if (fd < 0)
		return fd;

	memset(&saddr, 0, sizeof(saddr));
	saddr.sin_family = AF_INET;
	saddr.sin_addr = addr;
	saddr.sin_port = htons(NETTLP_MSG_PORT);
	ret = connect(fd, (struct sockaddr *)&saddr, sizeof(saddr));
	if (ret < 0)
		return ret;

	return fd;
}